

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O2

void TestBignumDtoaGayShortestSingle(void)

{
  uint uVar1;
  char *expected_source;
  PrecomputedShortestSingle *pPVar2;
  ulong uVar3;
  ulong uVar4;
  int *length_00;
  Vector<const_double_conversion::PrecomputedShortestSingle> VVar5;
  Vector<char> buffer;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *value_source;
  
  VVar5 = double_conversion::PrecomputedShortestSingleRepresentations();
  pPVar2 = VVar5.start_;
  uVar4 = 0;
  uVar3 = VVar5._8_8_ & 0xffffffff;
  if (VVar5.length_ < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    expected_source = *(char **)((long)&pPVar2->representation + uVar4);
    uVar1 = *(uint *)((long)&pPVar2->decimal_point + uVar4);
    value_source = &length;
    length_00 = &point;
    buffer._8_8_ = value_source;
    buffer.start_ = (char *)0x64;
    double_conversion::BignumDtoa
              ((double_conversion *)0x1,(double)*(float *)((long)&pPVar2->v + uVar4),
               BIGNUM_DTOA_SHORTEST,(int)buffer_container,buffer,length_00,in_stack_ffffffffffffff58
              );
    CheckEqualsHelper((char *)0x162,0xc0d28e,(char *)(ulong)uVar1,point,(char *)value_source,
                      (int)length_00);
    CheckEqualsHelper((char *)0x163,0xc0d2a9,expected_source,buffer_container,(char *)value_source,
                      (char *)length_00);
  }
  return;
}

Assistant:

TEST(BignumDtoaGayShortestSingle) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedShortestSingle> precomputed =
      PrecomputedShortestSingleRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortestSingle current_test = precomputed[i];
    float v = current_test.v;
    BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}